

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-coroutine-test.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_0::simpleCoroutine<void>
          (anon_unknown_0 *this,Promise<void> *result,Promise<bool> *dontThrow)

{
  bool bVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  undefined8 *puVar2;
  Coroutine<void> *this_00;
  Promise<bool> *promise;
  Promise<void> *promise_00;
  Promise<void> *this_01;
  Promise<bool> *this_02;
  PromiseAwaiter<bool> *__return_storage_ptr__;
  PromiseAwaiter<void> *__return_storage_ptr___00;
  void *pvVar3;
  undefined4 in_stack_fffffffffffff8c0;
  undefined4 in_stack_fffffffffffff8c4;
  Fault local_458;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  Promise<bool> *dontThrow_local;
  Promise<void> *result_local;
  
  puVar2 = (undefined8 *)operator_new(0x5e0);
  *puVar2 = simpleCoroutine<void>;
  puVar2[1] = simpleCoroutine<void>;
  this_01 = (Promise<void> *)(puVar2 + 0xb8);
  this_02 = (Promise<bool> *)(puVar2 + 0xb9);
  __return_storage_ptr__ = (PromiseAwaiter<bool> *)(puVar2 + 0x47);
  __return_storage_ptr___00 = (PromiseAwaiter<void> *)(puVar2 + 0x7e);
  this_00 = (Coroutine<void> *)(puVar2 + 2);
  Promise<void>::Promise(this_01,result);
  Promise<bool>::Promise(this_02,dontThrow);
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar2 + 0xb5),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
             ,"simpleCoroutine",0x35,0xc);
  pvVar3 = (void *)puVar2[0xb7];
  kj::_::Coroutine<void>::Coroutine(this_00,*(SourceLocation *)(puVar2 + 0xb5));
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar1 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar2 + 0x5dd));
  if (bVar1) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar2 + 0x5dd));
    promise = kj::_::Coroutine<void>::await_transform<kj::Promise<bool>&>(this_00,this_02);
    co_await<bool>(__return_storage_ptr__,promise);
    bVar1 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
    if (!bVar1) {
      *(undefined1 *)((long)puVar2 + 0x5dc) = 1;
      _GLOBAL__N_1::simpleCoroutine
                ((void *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),pvVar3);
      if ((extraout_AL & 1) != 0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    bVar1 = kj::_::PromiseAwaiter<bool>::await_resume(__return_storage_ptr__);
    kj::_::PromiseAwaiter<bool>::~PromiseAwaiter(__return_storage_ptr__);
    *(bool *)((long)puVar2 + 0x5de) = bVar1;
    f.exception = (Exception *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                             (bool *)((long)puVar2 + 0x5de));
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&f);
    if (!bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
                (&local_458,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
                 ,0x3b,FAILED,"resolved","_kjCondition,",(DebugExpression<bool_&> *)&f);
      kj::_::Debug::Fault::fatal(&local_458);
    }
    promise_00 = kj::_::Coroutine<void>::await_transform<kj::Promise<void>&>(this_00,this_01);
    co_await<void>(__return_storage_ptr___00,promise_00);
    bVar1 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr___00);
    if (!bVar1) {
      *(undefined1 *)((long)puVar2 + 0x5dc) = 2;
      _GLOBAL__N_1::simpleCoroutine
                ((void *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),pvVar3);
      if ((extraout_AL_00 & 1) != 0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr___00);
    kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr___00);
    kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
              ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)this_00);
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
    bVar1 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0x5df));
    if (bVar1) {
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0x5df));
      kj::_::Coroutine<void>::~Coroutine(this_00);
      Promise<bool>::~Promise(this_02);
      Promise<void>::~Promise(this_01);
      if (puVar2 != (undefined8 *)0x0) {
        operator_delete(puVar2,0x5e0);
      }
    }
    else {
      *puVar2 = 0;
      *(undefined1 *)((long)puVar2 + 0x5dc) = 3;
      _GLOBAL__N_1::simpleCoroutine
                ((void *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),pvVar3);
    }
  }
  else {
    *(undefined1 *)((long)puVar2 + 0x5dc) = 0;
    _GLOBAL__N_1::simpleCoroutine
              ((void *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),pvVar3);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> simpleCoroutine(kj::Promise<T> result, kj::Promise<bool> dontThrow = true) {
  // TODO(cleanup): Storing the coroutine result in a variable to work around
  // https://developercommunity.visualstudio.com/t/certain-coroutines-cause-error-C7587:-/10311276,
  // which caused a compile error here. This was supposed to be resolved with version 17.9, but
  // appears to still be happening as of 17.9.6. Clean up once this has been fixed.
  auto resolved = co_await dontThrow;
  KJ_ASSERT(resolved);
  co_return co_await result;
}